

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O3

size_t merge_existing_groups
                 (econf_file *dest_kf,file_entry **fe,econf_file *uf,econf_file *ef,size_t etc_start
                 )

{
  file_entry *pfVar1;
  file_entry *pfVar2;
  file_entry fe_00;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong local_c8;
  size_t local_c0;
  size_t local_b8;
  file_entry local_68;
  
  local_c8 = etc_start;
  if (ef != (econf_file *)0x0 && uf != (econf_file *)0x0) {
    uVar9 = uf->length;
    uVar6 = 0;
    uVar12 = uVar9;
    local_c0 = etc_start;
    local_b8 = etc_start;
    do {
      if ((uVar6 == uVar12) ||
         ((uVar11 = uVar12, uVar6 != 0 &&
          (iVar5 = strcmp(uf->file_entry[uVar6].group,uf->file_entry[uVar6 - 1].group), iVar5 != 0))
         )) {
        if (etc_start < ef->length) {
          sVar10 = etc_start;
          do {
            pfVar1 = ef->file_entry;
            iVar5 = strcmp(uf->file_entry[uVar6 - 1].group,pfVar1[sVar10].group);
            if (iVar5 == 0) {
              pfVar2 = *fe;
              if (local_c8 < local_b8 + uVar6) {
                pcVar8 = pfVar1[sVar10].key;
                lVar7 = local_c8 * 0x38 + 0x10;
                uVar9 = local_c8;
                do {
                  iVar5 = strcmp(*(char **)((long)pfVar2 + lVar7 + -8),pcVar8);
                  if (iVar5 == 0) {
                    free(*(void **)((long)&pfVar2->group + lVar7));
                    pcVar8 = ef->file_entry[sVar10].value;
                    if (pcVar8 == (char *)0x0) {
                      pcVar8 = "";
                    }
                    pcVar8 = strdup(pcVar8);
                    *(char **)((long)&(*fe)->group + lVar7) = pcVar8;
                    goto LAB_0010582b;
                  }
                  uVar9 = uVar9 + 1;
                  lVar7 = lVar7 + 0x38;
                } while (uVar9 < local_b8 + uVar6);
              }
              cpy_file_entry(&local_68,dest_kf,pfVar1[sVar10]);
              pfVar2[uVar6 + local_c0].quotes = local_68.quotes;
              *(undefined7 *)&pfVar2[uVar6 + local_c0].field_0x31 = local_68._49_7_;
              pfVar2[uVar6 + local_c0].comment_after_value = local_68.comment_after_value;
              (&pfVar2[uVar6 + local_c0].comment_after_value)[1] = (char *)local_68.line_number;
              pfVar2[uVar6 + local_c0].value = local_68.value;
              (&pfVar2[uVar6 + local_c0].value)[1] = local_68.comment_before_key;
              pfVar2[uVar6 + local_c0].group = local_68.group;
              pfVar2[uVar6 + local_c0].key = local_68.key;
              local_c0 = local_c0 + 1;
            }
LAB_0010582b:
            sVar10 = sVar10 + 1;
          } while (sVar10 < ef->length);
          uVar9 = uf->length;
        }
        local_c8 = local_c0 + uVar6;
        local_b8 = local_c0;
        uVar11 = uVar9;
      }
      uVar12 = uVar6;
      if (uVar6 != uVar11) {
        pfVar1 = *fe;
        pfVar2 = uf->file_entry;
        uVar3 = pfVar2[uVar6].group;
        uVar4 = pfVar2[uVar6].key;
        fe_00.key = (char *)uVar4;
        fe_00.group = (char *)uVar3;
        fe_00.value = pfVar2[uVar6].value;
        fe_00.comment_before_key = (&pfVar2[uVar6].value)[1];
        fe_00.comment_after_value = pfVar2[uVar6].comment_after_value;
        fe_00.line_number = (uint64_t)(&pfVar2[uVar6].comment_after_value)[1];
        fe_00.quotes = pfVar2[uVar6].quotes;
        fe_00._49_7_ = *(undefined7 *)&pfVar2[uVar6].field_0x31;
        cpy_file_entry(&local_68,dest_kf,fe_00);
        pfVar1[uVar6 + local_c0].quotes = local_68.quotes;
        *(undefined7 *)&pfVar1[uVar6 + local_c0].field_0x31 = local_68._49_7_;
        pfVar1[uVar6 + local_c0].comment_after_value = local_68.comment_after_value;
        (&pfVar1[uVar6 + local_c0].comment_after_value)[1] = (char *)local_68.line_number;
        pfVar1[uVar6 + local_c0].value = local_68.value;
        (&pfVar1[uVar6 + local_c0].value)[1] = local_68.comment_before_key;
        pfVar1[uVar6 + local_c0].group = local_68.group;
        pfVar1[uVar6 + local_c0].key = local_68.key;
        uVar9 = uf->length;
        uVar12 = uVar9;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 <= uVar12);
  }
  return local_c8;
}

Assistant:

size_t merge_existing_groups(econf_file *dest_kf, struct file_entry **fe, econf_file *uf,
			     econf_file *ef, const size_t etc_start) {
  bool new_key;
  size_t merge_length = etc_start, tmp = etc_start, added_keys = etc_start;
  if (uf && ef) {
    for (size_t i = 0; i <= uf->length; i++) {
      // Check if the group has changed in the last iteration
      if (i == uf->length ||
	  (i && strcmp(uf->file_entry[i].group, uf->file_entry[i - 1].group))) {
	for (size_t j = etc_start; j < ef->length; j++) {
	  // Check for matching groups
	  if (!strcmp(uf->file_entry[i - 1].group, ef->file_entry[j].group)) {
	    new_key = true;
	    for (size_t k = merge_length; k < i + tmp; k++) {
	      // If an existing key is found in ef take the value from ef
	      if (!strcmp((*fe)[k].key, ef->file_entry[j].key)) {
		free((*fe)[k].value);
		(*fe)[k].value = ef->file_entry[j].value ? strdup(ef->file_entry[j].value) : strdup("");
		new_key = false;
		break;
	      }
	    }
	    // If a new key is found for an existing group append it to the group
	    if (new_key)
	      (*fe)[i + added_keys++] = cpy_file_entry(dest_kf, ef->file_entry[j]);
	  }
	}
	merge_length = i + added_keys;
	// Temporary value to reduce amount of iterations in inner for loop
	tmp = added_keys;
      }
      if (i != uf->length)
	(*fe)[i + added_keys] = cpy_file_entry(dest_kf, uf->file_entry[i]);
    }
  }
  return merge_length;
}